

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::lookingAtLookupToken(SelectionCompiler *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  
  uVar2 = this->ichToken;
  uVar3 = this->cchScript;
  if (uVar2 == uVar3) goto LAB_0025851e;
  uVar8 = uVar2 + 1;
  pcVar4 = (this->script)._M_dataplus._M_p;
  bVar1 = pcVar4[(int)uVar2];
  uVar7 = (ulong)(bVar1 - 0x28);
  if (bVar1 - 0x28 < 0x36) {
    if ((0x28000000000013U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x700000UL >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 != 7) goto LAB_002584da;
        goto LAB_002584fc;
      }
      if ((int)uVar8 < (int)uVar3) {
        uVar6 = uVar2 + 2;
        if (2 < (byte)(pcVar4[(int)uVar8] - 0x3cU)) {
          uVar6 = uVar8;
        }
        uVar7 = (ulong)uVar6;
        goto LAB_00258515;
      }
    }
LAB_00258513:
    uVar7 = (ulong)uVar8;
  }
  else {
LAB_002584da:
    if (bVar1 == 0x21) {
LAB_002584fc:
      if ((int)uVar3 <= (int)uVar8) goto LAB_00258513;
      bVar10 = pcVar4[(int)uVar8] == '=';
LAB_0025850e:
      uVar6 = uVar2 + 2;
      if (!bVar10) {
        uVar6 = uVar8;
      }
      uVar7 = (ulong)uVar6;
    }
    else {
      if ((bVar1 == 0x26) || (bVar1 == 0x7c)) {
        if ((int)uVar3 <= (int)uVar8) goto LAB_00258513;
        bVar10 = pcVar4[(int)uVar8] == bVar1;
        goto LAB_0025850e;
      }
      uVar7 = (ulong)(int)uVar8;
      if ((int)uVar8 < (int)uVar3) {
        uVar8 = uVar3;
      }
      for (; (long)uVar7 < (long)(int)uVar3; uVar7 = uVar7 + 1) {
        bVar1 = pcVar4[uVar7];
        iVar9 = (int)(char)bVar1;
        iVar5 = isspace(iVar9);
        if ((iVar5 != 0) ||
           ((iVar5 = isalpha(iVar9), 9 < iVar9 - 0x30U && iVar5 == 0 &&
            ((uVar6 = bVar1 - 0x2a, 0x35 < uVar6 ||
             ((0x2a00000020001bU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))))) goto LAB_00258515;
      }
      uVar7 = (ulong)uVar8;
    }
  }
LAB_00258515:
  this->cchToken = (int)uVar7 - uVar2;
LAB_0025851e:
  return uVar2 != uVar3;
}

Assistant:

bool SelectionCompiler::lookingAtLookupToken() {
    if (ichToken == cchScript) { return false; }

    int ichT = ichToken;
    char ch;
    switch (ch = script[ichT++]) {
    case '(':
    case ')':
    case ',':
    case '[':
    case ']':
      break;
    case '&':
    case '|':
      if (ichT < cchScript && script[ichT] == ch) { ++ichT; }
      break;
    case '<':
    case '=':
    case '>':
      if (ichT < cchScript &&
          ((ch = script[ichT]) == '<' || ch == '=' || ch == '>')) {
        ++ichT;
      }
      break;
    case '/':
    case '!':
      if (ichT < cchScript && script[ichT] == '=') { ++ichT; }
      break;
    default:
      if ((ch < 'a' || ch > 'z') && (ch < 'A' && ch > 'Z') && ch != '_') {
        return false;
      }
      [[fallthrough]];
    case '*':
    case '?':  // include question marks in identifier for atom expressions
      while (ichT < cchScript && !std::isspace(ch = script[ichT]) &&
             (std::isalpha(ch) || std::isdigit(ch) || ch == '_' || ch == '.' ||
              ch == '*' || ch == '?' || ch == '+' || ch == '-' || ch == '[' ||
              ch == ']')) {
        ++ichT;
      }
      break;
    }

    cchToken = ichT - ichToken;

    return true;
  }